

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipState.hpp
# Opt level: O0

void __thiscall
linq::SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::Init
          (SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>
           *this)

{
  bool local_19;
  SkipState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&> *this_local;
  
  this->current = 0;
  AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::Init(&this->source);
  while( true ) {
    local_19 = false;
    if (this->current < this->count) {
      local_19 = AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::Valid(&this->source);
    }
    if (local_19 == false) break;
    AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>::Advance(&this->source);
    this->current = this->current + 1;
  }
  return;
}

Assistant:

void Init() override final
			{
				current = 0;
				source.Init(); 
				
				while(current < count && source.Valid()) {
					source.Advance();
					current++;
				}
			}